

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

bool __thiscall draco::ObjDecoder::ParseVertexIndices(ObjDecoder *this,array<int,_3UL> *out_indices)

{
  bool bVar1;
  reference pvVar2;
  DecoderBuffer *pDVar3;
  ObjDecoder *in_RDI;
  char ch;
  size_type in_stack_ffffffffffffffb8;
  array<int,_3UL> *in_stack_ffffffffffffffc0;
  DecoderBuffer *in_stack_ffffffffffffffc8;
  char local_19 [24];
  bool local_1;
  
  buffer(in_RDI);
  parser::SkipCharacters((DecoderBuffer *)in_RDI,(char *)in_stack_ffffffffffffffc8);
  buffer(in_RDI);
  std::array<int,_3UL>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar1 = parser::ParseSignedInt(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0->_M_elems);
  if ((bVar1) &&
     (pvVar2 = std::array<int,_3UL>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8)
     , *pvVar2 != 0)) {
    pvVar2 = std::array<int,_3UL>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *pvVar2 = 0;
    pvVar2 = std::array<int,_3UL>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *pvVar2 = 0;
    pDVar3 = buffer(in_RDI);
    bVar1 = DecoderBuffer::Peek<char>(pDVar3,local_19);
    if (bVar1) {
      if (local_19[0] == '/') {
        pDVar3 = buffer(in_RDI);
        DecoderBuffer::Advance(pDVar3,1);
        pDVar3 = buffer(in_RDI);
        bVar1 = DecoderBuffer::Peek<char>(pDVar3,local_19);
        if (bVar1) {
          if (local_19[0] != '/') {
            in_stack_ffffffffffffffc8 = buffer(in_RDI);
            std::array<int,_3UL>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
            bVar1 = parser::ParseSignedInt
                              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0->_M_elems);
            if ((!bVar1) ||
               (pvVar2 = std::array<int,_3UL>::operator[]
                                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
               *pvVar2 == 0)) {
              return false;
            }
          }
          pDVar3 = buffer(in_RDI);
          bVar1 = DecoderBuffer::Peek<char>(pDVar3,local_19);
          if (bVar1) {
            if (local_19[0] == '/') {
              pDVar3 = buffer(in_RDI);
              DecoderBuffer::Advance(pDVar3,1);
              pDVar3 = buffer(in_RDI);
              std::array<int,_3UL>::operator[]((array<int,_3UL> *)pDVar3,in_stack_ffffffffffffffb8);
              bVar1 = parser::ParseSignedInt(in_stack_ffffffffffffffc8,(int32_t *)pDVar3);
              if ((!bVar1) ||
                 (pvVar2 = std::array<int,_3UL>::operator[]
                                     ((array<int,_3UL> *)pDVar3,in_stack_ffffffffffffffb8),
                 *pvVar2 == 0)) {
                return false;
              }
            }
            local_1 = true;
          }
          else {
            local_1 = true;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ObjDecoder::ParseVertexIndices(std::array<int32_t, 3> *out_indices) {
  // Parsed attribute indices can be in format:
  // 1. POS_INDEX
  // 2. POS_INDEX/TEX_COORD_INDEX
  // 3. POS_INDEX/TEX_COORD_INDEX/NORMAL_INDEX
  // 4. POS_INDEX//NORMAL_INDEX
  parser::SkipCharacters(buffer(), " \t");
  if (!parser::ParseSignedInt(buffer(), &(*out_indices)[0]) ||
      (*out_indices)[0] == 0) {
    return false;  // Position index must be present and valid.
  }
  (*out_indices)[1] = (*out_indices)[2] = 0;
  char ch;
  if (!buffer()->Peek(&ch)) {
    return true;  // It may be OK if we cannot read any more characters.
  }
  if (ch != '/') {
    return true;
  }
  buffer()->Advance(1);
  // Check if we should skip texture index or not.
  if (!buffer()->Peek(&ch)) {
    return false;  // Here, we should be always able to read the next char.
  }
  if (ch != '/') {
    // Must be texture coord index.
    if (!parser::ParseSignedInt(buffer(), &(*out_indices)[1]) ||
        (*out_indices)[1] == 0) {
      return false;  // Texture index must be present and valid.
    }
  }
  if (!buffer()->Peek(&ch)) {
    return true;
  }
  if (ch == '/') {
    buffer()->Advance(1);
    // Read normal index.
    if (!parser::ParseSignedInt(buffer(), &(*out_indices)[2]) ||
        (*out_indices)[2] == 0) {
      return false;  // Normal index must be present and valid.
    }
  }
  return true;
}